

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connection.cpp
# Opt level: O0

bool __thiscall cube::net::TcpConnection::Write(TcpConnection *this,char *data,size_t len)

{
  bool bVar1;
  function<void_(std::shared_ptr<cube::net::TcpConnection>)> local_40;
  size_t local_20;
  size_t len_local;
  char *data_local;
  TcpConnection *this_local;
  
  local_20 = len;
  len_local = (size_t)data;
  data_local = (char *)this;
  std::function<void_(std::shared_ptr<cube::net::TcpConnection>)>::function
            (&local_40,(nullptr_t)0x0);
  bVar1 = Write(this,data,len,&local_40);
  std::function<void_(std::shared_ptr<cube::net::TcpConnection>)>::~function(&local_40);
  return bVar1;
}

Assistant:

bool TcpConnection::Write(const char *data, size_t len) {
    return Write(data, len, NULL);
}